

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O3

int __thiscall HydEngine::timeToCloseTank(HydEngine *this,int tstep)

{
  pointer ppNVar1;
  Tank *this_00;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  Tank *tank;
  pointer ppNVar6;
  Tank *pTVar7;
  Tank *pTVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  HydEngine *local_38;
  
  ppNVar6 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppNVar6 != ppNVar1) {
    pTVar7 = (Tank *)0x0;
    local_38 = this;
    do {
      this_00 = (Tank *)*ppNVar6;
      iVar2 = (*(this_00->super_Node).super_Element._vptr_Element[2])(this_00);
      pTVar8 = pTVar7;
      iVar3 = tstep;
      if (iVar2 == 1) {
        iVar3 = Tank::timeToVolume(this_00,this_00->minVolume);
        if (iVar3 < 1) {
          iVar3 = Tank::timeToVolume(this_00,this_00->maxVolume);
        }
        pTVar8 = this_00;
        if (iVar3 < 1 || tstep <= iVar3) {
          pTVar8 = pTVar7;
          iVar3 = tstep;
        }
      }
      tstep = iVar3;
      ppNVar6 = ppNVar6 + 1;
      pTVar7 = pTVar8;
    } while (ppNVar6 != ppNVar1);
    if (pTVar8 != (Tank *)0x0) {
      std::operator+(&local_78,"  (Tank ",&(pTVar8->super_Node).super_Element.name);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_48 = *plVar5;
        lStack_40 = plVar4[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar5;
        local_58 = (long *)*plVar4;
      }
      local_50 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_38->timeStepReason,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
  }
  return tstep;
}

Assistant:

int HydEngine::timeToCloseTank(int tstep)
{
    Tank* closedTank = nullptr;
    for (Node* node : network->nodes)
    {
        // ... check if node is a tank

        if ( node->type() == Node::TANK )
        {
            // ... find the time to fill (or empty) the tank

            Tank* tank = static_cast<Tank*>(node);
            int t = tank->timeToVolume(tank->minVolume);
            if ( t <= 0 ) t = tank->timeToVolume(tank->maxVolume);

            // ... compare this time with current time step

            if ( t > 0 && t < tstep )
            {
                tstep = t;
                closedTank = tank;
            }
        }
    }
    if ( closedTank )
    {
        timeStepReason = "  (Tank " + closedTank->name + " closed)";
    }
    return tstep;
}